

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

void __thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::Resize
          (Stack<rapidjson::CrtAllocator> *this,size_t newCapacity)

{
  size_t sVar1;
  char *pcVar2;
  long in_RSI;
  Stack<rapidjson::CrtAllocator> *in_RDI;
  size_t size;
  size_t in_stack_ffffffffffffffc8;
  CrtAllocator *originalPtr;
  CrtAllocator *this_00;
  
  sVar1 = GetSize(in_RDI);
  originalPtr = in_RDI->allocator_;
  this_00 = (CrtAllocator *)in_RDI->stack_;
  GetCapacity(in_RDI);
  pcVar2 = (char *)CrtAllocator::Realloc(this_00,originalPtr,in_stack_ffffffffffffffc8,0x1adf54);
  in_RDI->stack_ = pcVar2;
  in_RDI->stackTop_ = in_RDI->stack_ + sVar1;
  in_RDI->stackEnd_ = in_RDI->stack_ + in_RSI;
  return;
}

Assistant:

void Resize(size_t newCapacity) {
        const size_t size = GetSize();  // Backup the current size
        stack_ = static_cast<char*>(allocator_->Realloc(stack_, GetCapacity(), newCapacity));
        stackTop_ = stack_ + size;
        stackEnd_ = stack_ + newCapacity;
    }